

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie_test.cpp
# Opt level: O1

int trie_iterator_cb_print(trie t,trie_key key,trie_value value,trie_cb_iterate_args args)

{
  if (value != (trie_value)0x0 && (key != (trie_key)0x0 && t != (trie)0x0)) {
    log_write_impl_va("metacall",0x2c,"trie_iterator_cb_print",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_trie_test/source/adt_trie_test.cpp"
                      ,0,"%s : %s",key,value);
  }
  return (uint)(value == (trie_value)0x0 || (key == (trie_key)0x0 || t == (trie)0x0));
}

Assistant:

int trie_iterator_cb_print(trie t, trie_key key, trie_value value, trie_cb_iterate_args args)
{
	(void)args;

	if (t != NULL && key != NULL && value != NULL)
	{
		const char *key_str = reinterpret_cast<const char *>(key);
		const char *value_str = reinterpret_cast<const char *>(value);

		log_write("metacall", LOG_LEVEL_DEBUG, "%s : %s", key_str, value_str);

		return 0;
	}

	return 1;
}